

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmVarHeapHybrid::CVmVarHeapHybrid(CVmVarHeapHybrid *this,CVmObjTable *objtab)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  CVmVarHeapHybrid_head *this_00;
  CVmVarHeapHybrid *mem_mgr;
  CVmVarHeapHybrid_malloc *this_01;
  _func_int **in_RSI;
  CVmVarHeap *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  CVmVarHeapHybrid *in_stack_ffffffffffffffb8;
  CVmVarHeapHybrid_head *in_stack_ffffffffffffffc0;
  
  CVmVarHeap::CVmVarHeap(in_RDI);
  in_RDI->_vptr_CVmVarHeap = (_func_int **)&PTR__CVmVarHeapHybrid_00447688;
  in_RDI[5]._vptr_CVmVarHeap = in_RSI;
  in_RDI[3]._vptr_CVmVarHeap = (_func_int **)0x5;
  pp_Var1 = (_func_int **)malloc((long)in_RDI[3]._vptr_CVmVarHeap << 3);
  in_RDI[2]._vptr_CVmVarHeap = pp_Var1;
  if (in_RDI[2]._vptr_CVmVarHeap == (_func_int **)0x0) {
    err_throw(0);
  }
  p_Var2 = (_func_int *)operator_new(0x28);
  CVmVarHeapHybrid_head::CVmVarHeapHybrid_head
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *in_RDI[2]._vptr_CVmVarHeap = p_Var2;
  p_Var2 = (_func_int *)operator_new(0x28);
  CVmVarHeapHybrid_head::CVmVarHeapHybrid_head
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  in_RDI[2]._vptr_CVmVarHeap[1] = p_Var2;
  this_00 = (CVmVarHeapHybrid_head *)operator_new(0x28);
  CVmVarHeapHybrid_head::CVmVarHeapHybrid_head
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[2]._vptr_CVmVarHeap[2] = (_func_int *)this_00;
  mem_mgr = (CVmVarHeapHybrid *)operator_new(0x28);
  CVmVarHeapHybrid_head::CVmVarHeapHybrid_head
            (this_00,mem_mgr,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[2]._vptr_CVmVarHeap[3] = (_func_int *)mem_mgr;
  this_01 = (CVmVarHeapHybrid_malloc *)operator_new(0x28);
  CVmVarHeapHybrid_head::CVmVarHeapHybrid_head
            (this_00,mem_mgr,(size_t)this_01,in_stack_ffffffffffffffa8);
  in_RDI[2]._vptr_CVmVarHeap[4] = (_func_int *)this_01;
  pp_Var1 = (_func_int **)operator_new(8);
  memset(pp_Var1,0,8);
  CVmVarHeapHybrid_malloc::CVmVarHeapHybrid_malloc(this_01);
  in_RDI[4]._vptr_CVmVarHeap = pp_Var1;
  in_RDI[1]._vptr_CVmVarHeap = (_func_int **)0x0;
  return;
}

Assistant:

CVmVarHeapHybrid::CVmVarHeapHybrid(CVmObjTable *objtab)
{
    /* remember my object table */
    objtab_ = objtab;

    /* set the cell heap count */
    cell_heap_cnt_ = 5;

    /* allocate our cell heap pointer array */
    cell_heaps_ = (CVmVarHeapHybrid_head **)
                  t3malloc(cell_heap_cnt_ * sizeof(CVmVarHeapHybrid_head *));

    /* if that failed, throw an error */
    if (cell_heaps_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* 
     *   Allocate our cell heaps.  Set up the heaps so that the pages run
     *   about 32k each.  
     */
    cell_heaps_[0] = new CVmVarHeapHybrid_head(this, 32, 850);
    cell_heaps_[1] = new CVmVarHeapHybrid_head(this, 64, 400);
    cell_heaps_[2] = new CVmVarHeapHybrid_head(this, 128, 200);
    cell_heaps_[3] = new CVmVarHeapHybrid_head(this, 256, 100);
    cell_heaps_[4] = new CVmVarHeapHybrid_head(this, 512, 50);

    /* allocate our malloc heap manager */
    malloc_heap_ = new CVmVarHeapHybrid_malloc();

    /* we haven't allocated any cell array pages yet */
    first_array_ = 0;
}